

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextQueueDock
               (ImGuiContext *ctx,ImGuiWindow *target,ImGuiDockNode *target_node,
               ImGuiWindow *payload,ImGuiDir split_dir,float split_ratio,bool split_outer)

{
  ImGuiDockRequest local_40;
  
  if (target != payload) {
    local_40.UndockTargetWindow = (ImGuiWindow *)0x0;
    local_40.UndockTargetNode = (ImGuiDockNode *)0x0;
    local_40.Type = ImGuiDockRequestType_Dock;
    local_40.DockTargetWindow = target;
    local_40.DockTargetNode = target_node;
    local_40.DockPayload = payload;
    local_40.DockSplitDir = split_dir;
    local_40.DockSplitRatio = split_ratio;
    local_40.DockSplitOuter = split_outer;
    ImVector<ImGuiDockRequest>::push_back(&(ctx->DockContext).Requests,&local_40);
    return;
  }
  __assert_fail("target != payload",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x336b,
                "void ImGui::DockContextQueueDock(ImGuiContext *, ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDir, float, bool)"
               );
}

Assistant:

void ImGui::DockContextQueueDock(ImGuiContext* ctx, ImGuiWindow* target, ImGuiDockNode* target_node, ImGuiWindow* payload, ImGuiDir split_dir, float split_ratio, bool split_outer)
{
    IM_ASSERT(target != payload);
    ImGuiDockRequest req;
    req.Type = ImGuiDockRequestType_Dock;
    req.DockTargetWindow = target;
    req.DockTargetNode = target_node;
    req.DockPayload = payload;
    req.DockSplitDir = split_dir;
    req.DockSplitRatio = split_ratio;
    req.DockSplitOuter = split_outer;
    ctx->DockContext.Requests.push_back(req);
}